

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateMergeFromCodedStream
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  
  io::Printer::Print(printer,&this->variables_,
                     "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n      input, this->add_$name$()));\n"
                    );
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this->descriptor_,(this->super_FieldGenerator).options_,true,&this->variables_,
               "this->$name$(this->$name$_size() - 1).data(),\nthis->$name$(this->$name$_size() - 1).length(),\n"
               ,printer);
    return;
  }
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n"
    "      input, this->add_$name$()));\n");
  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, true, variables_,
        "this->$name$(this->$name$_size() - 1).data(),\n"
        "this->$name$(this->$name$_size() - 1).length(),\n",
        printer);
  }
}